

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_patch
          (BinBinaryReader *this,Hash *patchKeyHash,Embed *patch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint *puVar3;
  BinCompat *pBVar4;
  uint uVar5;
  bool bVar6;
  char cVar7;
  ssize_t sVar8;
  size_t in_RCX;
  size_t __nbytes;
  uint *puVar9;
  void *__buf;
  char *extraout_RDX;
  uint *pos;
  char *extraout_RDX_00;
  char *pcVar10;
  string_view str;
  string_view str_00;
  Type type;
  String name;
  Type local_231;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  undefined8 uStack_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  FNV1a *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  FNV1a *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  uint32_t local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  FNV1a *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  uint32_t local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  undefined8 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  uint *local_180;
  Field local_178;
  _Variadic_union<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_108;
  undefined8 local_c8;
  _Variadic_union<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_c0;
  undefined1 local_80;
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_78;
  
  puVar9 = (uint *)(this->reader).cur_;
  sVar8 = BinaryReader::read(&this->reader,(int)patchKeyHash,patch,in_RCX);
  if ((char)sVar8 == '\0') {
    pcVar10 = "reader.read(patchKeyHash.value)";
LAB_00113699:
    bVar6 = fail_msg(this,pcVar10,(char *)puVar9);
    return bVar6;
  }
  puVar9 = (uint *)(this->reader).cur_;
  puVar3 = (uint *)(this->reader).cap_;
  pos = puVar9 + 1;
  if (puVar3 < pos) {
    pcVar10 = "reader.read(patchLength)";
    goto LAB_00113699;
  }
  uVar2 = *puVar9;
  (this->reader).cur_ = (char *)pos;
  pcVar10 = (this->reader).beg_;
  __nbytes = 0;
  local_231 = NONE;
  local_230 = &local_220;
  local_228 = 0;
  local_220 = 0;
  local_c8 = 0;
  local_108._48_8_ = 0;
  local_108._56_8_ = 0;
  local_108._32_8_ = 0;
  local_108._40_8_ = 0;
  local_108._16_8_ = 0;
  local_108._24_8_ = 0;
  local_108._0_8_ = 0;
  local_108._8_8_ = 0;
  if (puVar3 < (uint *)((long)puVar9 + 5)) {
LAB_001137eb:
    pcVar10 = "reader.read(type)";
  }
  else {
    uVar5 = *pos;
    (this->reader).cur_ = (char *)((long)puVar9 + 5);
    pBVar4 = (this->reader).compat_;
    cVar7 = (**(code **)(*(long *)pBVar4 + 0x10))(pBVar4,(char)uVar5,&local_231);
    if (cVar7 == '\0') goto LAB_001137eb;
    local_180 = (uint *)(this->reader).cur_;
    sVar8 = BinaryReader::read(&this->reader,(int)&local_230,__buf,__nbytes);
    if ((char)sVar8 == '\0') {
      pcVar10 = "reader.read(name.value)";
      pos = local_180;
    }
    else {
      puVar9 = (uint *)(this->reader).cur_;
      bVar6 = read_value_of(this,(Value *)&local_108,local_231);
      if (bVar6) {
        puVar9 = (uint *)(this->reader).cur_;
        if ((undefined1 *)((long)puVar9 - (long)(this->reader).beg_) ==
            (undefined1 *)((long)pos + ((ulong)uVar2 - (long)pcVar10))) {
          local_1f0 = &local_1e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"path","");
          str._M_str = extraout_RDX;
          str._M_len = (size_t)local_1f0;
          local_1a8 = FNV1a::fnv1a(local_1e8,str);
          local_178.key.str_._M_string_length = (size_type)local_1e8;
          if (local_1f0 == &local_1e0) {
            local_190._8_8_ = local_1e0._8_8_;
            local_1f0 = &local_190;
          }
          local_1e8 = (FNV1a *)0x0;
          local_1e0._M_local_buf[0] = '\0';
          local_c0._0_8_ = (long)&local_c0 + 0x10;
          if (local_230 == &local_220) {
            local_c0._24_8_ = uStack_218;
          }
          else {
            local_c0._0_8_ = local_230;
          }
          local_c0._17_7_ = uStack_21f;
          local_c0._16_1_ = local_220;
          local_c0._8_8_ = local_228;
          local_228 = 0;
          local_220 = 0;
          local_80 = 0x10;
          paVar1 = &local_178.key.str_.field_2;
          local_178.key.str_._M_dataplus._M_p = (pointer)local_1f0;
          if (local_1f0 == &local_190) {
            local_178.key.str_.field_2._8_8_ = local_190._8_8_;
            local_178.key.str_._M_dataplus._M_p = (pointer)paVar1;
          }
          local_198 = 0;
          local_190._M_allocated_capacity = (ulong)(uint7)local_1e0._M_allocated_capacity._1_7_ << 8
          ;
          local_230 = &local_220;
          local_1f0 = &local_1e0;
          local_1a0 = &local_190;
          local_178.key.hash_ = local_1a8;
          std::__detail::__variant::
          _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_178.value,
                            (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_c0);
          std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<ritobin::Field>
                    (&patch->items,&local_178);
          Field::~Field(&local_178);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)&local_c0);
          if (local_1a0 != &local_190) {
            operator_delete(local_1a0,local_190._M_allocated_capacity + 1);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0,
                            CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]
                                    ) + 1);
          }
          local_210 = &local_200;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"value","");
          str_00._M_str = extraout_RDX_00;
          str_00._M_len = (size_t)local_210;
          local_1d0 = FNV1a::fnv1a(local_208,str_00);
          if (local_210 == &local_200) {
            local_1b8._8_8_ = local_200._8_8_;
            local_1c8 = &local_1b8;
          }
          else {
            local_1c8 = local_210;
          }
          local_1b8._M_allocated_capacity = (ulong)(uint7)local_200._M_allocated_capacity._1_7_ << 8
          ;
          local_1c0 = local_208;
          local_208 = (FNV1a *)0x0;
          local_200._M_local_buf[0] = '\0';
          local_210 = &local_200;
          std::__detail::__variant::
          _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_78,
                            (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_108);
          local_178.key.hash_ = local_1d0;
          if (local_1c8 == &local_1b8) {
            local_178.key.str_.field_2._8_8_ = local_1b8._8_8_;
            local_178.key.str_._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_178.key.str_._M_dataplus._M_p = (pointer)local_1c8;
          }
          local_178.key.str_._M_string_length = (size_type)local_1c0;
          local_1c0 = (FNV1a *)0x0;
          local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8 = &local_1b8;
          std::__detail::__variant::
          _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_178.value,
                            (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_78);
          std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<ritobin::Field>
                    (&patch->items,&local_178);
          Field::~Field(&local_178);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage(&local_78);
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,local_1b8._M_allocated_capacity + 1);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,
                            CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0]
                                    ) + 1);
          }
          bVar6 = true;
          goto LAB_00113804;
        }
        pcVar10 = "reader.position() == position + patchLength";
        pos = puVar9;
      }
      else {
        pcVar10 = "read_value_of(value, type)";
        pos = puVar9;
      }
    }
  }
  bVar6 = fail_msg(this,pcVar10,(char *)pos);
LAB_00113804:
  std::__detail::__variant::
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                       *)&local_108);
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
  return bVar6;
}

Assistant:

bool read_patch(Hash& patchKeyHash, Embed& patch) {
            uint32_t patchLength = 0;
            bin_assert(reader.read(patchKeyHash.value));
            bin_assert(reader.read(patchLength));
            auto position = reader.position();
            Type type = {};
            String name = {};
            Value value = {};
            bin_assert(reader.read(type));
            bin_assert(reader.read(name.value));
            bin_assert(read_value_of(value, type));
            bin_assert(reader.position() == position + patchLength);
            patch.items.emplace_back(Field { {"path"}, std::move(name) });
            patch.items.emplace_back(Field { {"value"}, std::move(value) });
            return true;
        }